

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O2

int Base64Test_EncodeBlock_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<Base64Test> *this_01;
  TestMetaFactoryBase<Base64TestVector> *meta_factory;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  char local_b0 [8];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  CodeLocation local_80;
  CodeLocation local_58;
  string local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Base64Test",&local_c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64_test.cc"
             ,&local_c2);
  local_58.file._M_string_length = local_98;
  local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_58.file.field_2._8_8_ = uStack_88;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_a0;
  }
  local_98 = 0;
  local_90[0] = '\0';
  local_58.line = 0x8f;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<Base64Test>
                      (this_00,&local_30,&local_58);
  meta_factory = (TestMetaFactoryBase<Base64TestVector> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_00676a20;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64_test.cc"
             ,&local_c3);
  local_80.file._M_string_length = local_b8;
  local_80.file._M_dataplus._M_p = (pointer)&local_80.file.field_2;
  if (local_c0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0) {
    local_80.file.field_2._8_8_ = uStack_a8;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_b8 = 0;
  local_b0[0] = '\0';
  local_80.line = 0x8f;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0;
  testing::internal::ParameterizedTestSuiteInfo<Base64Test>::AddTestPattern
            (this_01,"Base64Test","EncodeBlock",meta_factory,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

TEST_P(Base64Test, EncodeBlock) {
  const Base64TestVector &t = GetParam();
  if (t.relation != canonical) {
    return;
  }

  const size_t decoded_len = strlen(t.decoded);
  size_t max_encoded_len;
  ASSERT_TRUE(EVP_EncodedLength(&max_encoded_len, decoded_len));

  std::vector<uint8_t> out_vec(max_encoded_len);
  uint8_t *out = out_vec.data();
  size_t len = EVP_EncodeBlock(out, (const uint8_t *)t.decoded, decoded_len);

  std::string encoded(RemoveNewlines(t.encoded));
  EXPECT_EQ(Bytes(encoded), Bytes(out, len));
}